

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

bool __thiscall
slang::CommandLine::parse(CommandLine *this,string_view argList,ParseOptions options)

{
  byte bVar1;
  size_type sVar2;
  iterator pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  iterator __end1;
  iterator __begin1;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *__range1;
  SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_8UL> args;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  storage;
  string current;
  bool hasArg;
  SmallVectorBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *item;
  SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_> *in_stack_fffffffffffffd60
  ;
  undefined7 in_stack_fffffffffffffd68;
  undefined1 in_stack_fffffffffffffd6f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd70;
  SmallVectorBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  iterator local_240;
  string *in_stack_fffffffffffffe28;
  bool *in_stack_fffffffffffffe30;
  CommandLine *in_stack_fffffffffffffe38;
  ParseOptions in_stack_fffffffffffffe44;
  string_view in_stack_fffffffffffffe48;
  SmallVectorBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe60;
  SmallVectorBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160 [5];
  byte local_21;
  
  local_21 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffffd70);
  item = local_160;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)0xea117f);
  this_00 = item;
  parseStr(in_stack_fffffffffffffe38,in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
           in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe60);
  if ((local_21 & 1) != 0) {
    SmallVectorBase<std::__cxx11::string>::emplace_back<std::__cxx11::string>
              ((SmallVectorBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd60);
  }
  sVar2 = SmallVectorBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(local_160);
  SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_8UL>::SmallVector
            ((SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_8UL> *)
             &stack0xfffffffffffffdd8,sVar2);
  local_240 = SmallVectorBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::begin(local_160);
  pbVar3 = SmallVectorBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::end(local_160);
  for (; local_240 != pbVar3; local_240 = local_240 + 1) {
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd60);
    SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::push_back
              (in_stack_fffffffffffffd60,(basic_string_view<char,_std::char_traits<char>_> *)item);
  }
  std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>::
  span<slang::SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_8UL>_&>
            ((span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
              *)this_00,
             (SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_8UL> *)
             CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
  bVar1 = parse((CommandLine *)
                storage.
                super_SmallVectorBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .firstElement._0_8_,
                (span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
                 )storage.
                  super_SmallVectorBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .firstElement._16_16_,
                (ParseOptions)
                storage.
                super_SmallVectorBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .firstElement._12_4_);
  SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_8UL>::~SmallVector
            ((SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_8UL> *)0xea1319);
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                  *)0xea1326);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd60);
  return (bool)(bVar1 & 1);
}

Assistant:

bool CommandLine::parse(std::string_view argList, ParseOptions options) {
    bool hasArg = false;
    std::string current;
    SmallVector<std::string, 8> storage;

    parseStr(argList, options, hasArg, current, storage);

    if (hasArg)
        storage.emplace_back(std::move(current));

    SmallVector<std::string_view, 8> args(storage.size(), UninitializedTag());
    for (auto& arg : storage)
        args.push_back(arg);

    return parse(args, options);
}